

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute<char[1]>(XmlWriter *this,string *name,char (*attribute) [1])

{
  size_t sVar1;
  XmlWriter *pXVar2;
  ostringstream local_1c0 [8];
  ostringstream oss;
  ios_base local_150 [264];
  string local_48;
  
  std::__cxx11::ostringstream::ostringstream(local_1c0);
  sVar1 = strlen(*attribute);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,*attribute,sVar1);
  std::__cxx11::stringbuf::str();
  pXVar2 = writeAttribute(this,name,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1c0);
  std::ios_base::~ios_base(local_150);
  return pXVar2;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, T const& attribute ) {
            std::ostringstream oss;
            oss << attribute;
            return writeAttribute( name, oss.str() );
        }